

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Colset * sqlite3Fts5ParseColsetInvert(Fts5Parse *pParse,Fts5Colset *p)

{
  int iVar1;
  int iVar2;
  Fts5Colset *pFVar3;
  int local_2c;
  int local_28;
  int iOld;
  int i;
  int nCol;
  Fts5Colset *pRet;
  Fts5Colset *p_local;
  Fts5Parse *pParse_local;
  
  iVar1 = pParse->pConfig->nCol;
  pFVar3 = (Fts5Colset *)sqlite3Fts5MallocZero(&pParse->rc,(long)iVar1 * 4 + 8);
  if (pFVar3 != (Fts5Colset *)0x0) {
    local_2c = 0;
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      if ((local_2c < p->nCol) && (p->aiCol[local_2c] == local_28)) {
        local_2c = local_2c + 1;
      }
      else {
        iVar2 = pFVar3->nCol;
        pFVar3->nCol = iVar2 + 1;
        pFVar3->aiCol[iVar2] = local_28;
      }
    }
  }
  sqlite3_free(p);
  return pFVar3;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColsetInvert(Fts5Parse *pParse, Fts5Colset *p){
  Fts5Colset *pRet;
  int nCol = pParse->pConfig->nCol;

  pRet = (Fts5Colset*)sqlite3Fts5MallocZero(&pParse->rc, 
      sizeof(Fts5Colset) + sizeof(int)*nCol
  );
  if( pRet ){
    int i;
    int iOld = 0;
    for(i=0; i<nCol; i++){
      if( iOld>=p->nCol || p->aiCol[iOld]!=i ){
        pRet->aiCol[pRet->nCol++] = i;
      }else{
        iOld++;
      }
    }
  }

  sqlite3_free(p);
  return pRet;
}